

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::For(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
      *this)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  eval_error *peVar7;
  _Alloc_hider _Var8;
  size_t t_match_start;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  Depth_Counter dc;
  string local_90;
  File_Position local_70;
  Depth_Counter local_68;
  string local_60;
  string local_40;
  
  Depth_Counter::Depth_Counter(&local_68,this);
  puVar1 = (this->m_match_stack).
           super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->m_match_stack).
           super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_90._M_dataplus._M_p = (pointer)0x3;
  local_90._M_string_length = 0x2069fa;
  bVar3 = Keyword(this,(Static_String *)&local_90);
  if (!bVar3) goto LAB_001b7fc4;
  bVar4 = Char(this,'(');
  if (!bVar4) {
    peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Incomplete \'for\' expression","");
    local_70.line = (this->m_position).line;
    local_70.column = (this->m_position).col;
    exception::eval_error::eval_error
              (peVar7,&local_90,&local_70,
               (this->m_filename).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  bVar4 = For_Guards(this);
  if (bVar4) {
    bVar5 = Char(this,')');
    bVar4 = true;
    if (!bVar5) goto LAB_001b7ede;
  }
  else {
LAB_001b7ede:
    bVar4 = Range_Expression(this);
    if (!bVar4) {
LAB_001b7fda:
      peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Incomplete \'for\' expression","");
      local_70.line = (this->m_position).line;
      local_70.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar7,&local_90,&local_70,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    bVar4 = Char(this,')');
    if (!bVar4) goto LAB_001b7fda;
    bVar4 = false;
  }
  t_match_start = (long)puVar1 - (long)puVar2 >> 3;
  do {
    bVar5 = Eol(this);
  } while (bVar5);
  bVar5 = Block(this);
  if (!bVar5) {
    peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Incomplete \'for\' block","");
    local_70.line = (this->m_position).line;
    local_70.column = (this->m_position).col;
    exception::eval_error::eval_error
              (peVar7,&local_90,&local_70,
               (this->m_filename).
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  lVar6 = ((long)(this->m_match_stack).
                 super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_match_stack).
                 super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) - t_match_start;
  if (bVar4) {
    if (lVar6 != 4) {
      peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Incomplete \'for\' expression","");
      local_70.line = (this->m_position).line;
      local_70.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar7,&local_90,&local_70,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    paVar9 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
    ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::
    build_match<chaiscript::eval::For_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)this,t_match_start,&local_40);
    _Var8._M_p = local_40._M_dataplus._M_p;
  }
  else {
    if (lVar6 != 3) {
      peVar7 = (eval_error *)__cxa_allocate_exception(0x90);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Incomplete ranged-for expression","");
      local_70.line = (this->m_position).line;
      local_70.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar7,&local_90,&local_70,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar7,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    paVar9 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
    ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::
    build_match<chaiscript::eval::Ranged_For_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)this,t_match_start,&local_60);
    _Var8._M_p = local_60._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var8._M_p != paVar9) {
    operator_delete(_Var8._M_p,paVar9->_M_allocated_capacity + 1);
  }
LAB_001b7fc4:
  (local_68.parser)->m_current_parse_depth = (local_68.parser)->m_current_parse_depth - 1;
  return bVar3;
}

Assistant:

bool For() {
        Depth_Counter dc{this};
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();

        if (Keyword("for")) {
          retval = true;

          if (!Char('(')) {
            throw exception::eval_error("Incomplete 'for' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          const bool classic_for = For_Guards() && Char(')');
          if (!classic_for && !(Range_Expression() && Char(')'))) {
            throw exception::eval_error("Incomplete 'for' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          while (Eol()) {
          }

          if (!Block()) {
            throw exception::eval_error("Incomplete 'for' block", File_Position(m_position.line, m_position.col), *m_filename);
          }

          const auto num_children = m_match_stack.size() - prev_stack_top;

          if (classic_for) {
            if (num_children != 4) {
              throw exception::eval_error("Incomplete 'for' expression", File_Position(m_position.line, m_position.col), *m_filename);
            }
            build_match<eval::For_AST_Node<Tracer>>(prev_stack_top);
          } else {
            if (num_children != 3) {
              throw exception::eval_error("Incomplete ranged-for expression", File_Position(m_position.line, m_position.col), *m_filename);
            }
            build_match<eval::Ranged_For_AST_Node<Tracer>>(prev_stack_top);
          }
        }

        return retval;
      }